

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::truncSatToSI64(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  bool bVar2;
  long lVar3;
  float fVar4;
  double dVar5;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined8 local_40;
  anon_union_16_5_9943fe1e_for_Literal_0 local_38;
  long local_28;
  double local_20;
  
  uVar1 = (this->type).id;
  if (uVar1 == 5) {
    Literal((Literal *)&local_38.func,this);
    if (local_28 != 5) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x15d,"Literal wasm::Literal::castToI64()");
    }
    local_40 = 3;
    local_50.i64 = CONCAT44(local_38.i64._4_4_,local_38.i32);
    local_20 = (double)local_50.i64;
    if (NAN((double)local_50.i64)) goto LAB_0094595d;
    bVar2 = isInRangeI64TruncS(local_50.i64);
    if (!bVar2) goto joined_r0x0094591e;
    dVar5 = ::trunc(local_20);
    lVar3 = (long)dVar5;
  }
  else {
    if (uVar1 != 4) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,800);
    }
    Literal((Literal *)&local_38.func,this);
    if (local_28 != 4) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x156,"Literal wasm::Literal::castToI32()");
    }
    local_40 = 2;
    local_50.i32 = local_38.i32;
    local_20 = (double)CONCAT44(local_20._4_4_,local_38.i32);
    if (NAN((float)local_38.i32)) {
LAB_0094595d:
      (__return_storage_ptr__->field_0).i64 = 0;
      goto LAB_00945926;
    }
    bVar2 = isInRangeI64TruncS(local_38.i32);
    local_38._4_4_ = local_38.i32;
    if (bVar2) {
      fVar4 = truncf(local_20._0_4_);
      lVar3 = (long)fVar4;
    }
    else {
joined_r0x0094591e:
      lVar3 = 0x7fffffffffffffff;
      if ((int)local_38.i64._4_4_ < 0) {
        lVar3 = -0x8000000000000000;
      }
    }
  }
  (__return_storage_ptr__->field_0).i64 = lVar3;
LAB_00945926:
  (__return_storage_ptr__->type).id = 3;
  ~Literal((Literal *)&local_50.func);
  ~Literal((Literal *)&local_38.func);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToSI64() const {
  if (type == Type::f32) {
    return saturating_trunc<float, int64_t, isInRangeI64TruncS>(
      Literal(*this).castToI32().geti32());
  }
  if (type == Type::f64) {
    return saturating_trunc<double, int64_t, isInRangeI64TruncS>(
      Literal(*this).castToI64().geti64());
  }
  WASM_UNREACHABLE("invalid type");
}